

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

void __thiscall soul::TaskThread::run(TaskThread *this)

{
  bool bVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  unique_lock<std::mutex> l;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  unique_lock<std::mutex> local_40;
  
  do {
    if ((this->shuttingDown).super___atomic_base<int>._M_i != 0) {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->queueLock);
    bVar3 = 0;
    for (uVar2 = 0;
        uVar4 = (long)(this->queues).
                      super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->queues).
                      super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3, uVar2 < uVar4;
        uVar2 = uVar2 + 1) {
      if ((this->shuttingDown).super___atomic_base<int>._M_i != 0) goto LAB_002974bc;
      bVar1 = Queue::serviceNextTask
                        ((this->queues).
                         super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      bVar3 = bVar3 | bVar1;
    }
    if (bVar3 == 0) {
      local_48.__r = 500;
      std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                (&this->checkQueues,&local_40,&local_48);
    }
LAB_002974bc:
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (uVar2 < uVar4) {
      return;
    }
  } while( true );
}

Assistant:

void run()
    {
        while (! shuttingDown)
        {
            bool anyTasksDone = false;
            std::unique_lock<std::mutex> l (queueLock);

            // NB: avoid iterator because the vector can be modified during the loop
            for (size_t i = 0; i < queues.size(); ++i)
            {
                if (shuttingDown)
                    return;

                if (queues[i]->serviceNextTask())
                    anyTasksDone = true;
            }

            if (! anyTasksDone)
                checkQueues.wait_for (l, std::chrono::milliseconds (500));
        }
    }